

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

int __thiscall QWidgetPrivate::init(QWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Int IVar2;
  BrushStyle BVar3;
  QWidget *parent;
  QApplication *pQVar4;
  QEvent *this_00;
  Int in_EDX;
  long in_FS_OFFSET;
  QBrush *background;
  QEvent e;
  QWidget *q;
  WindowFlags in_stack_00000120;
  QFont *in_stack_ffffffffffffff18;
  int awidth;
  QWidgetPrivate *in_stack_ffffffffffffff20;
  int aleft;
  QRect *in_stack_ffffffffffffff28;
  QFlagsStorage<Qt::WindowType> lhs;
  QEvent *this_01;
  QWidgetPrivate *in_stack_ffffffffffffff30;
  QSet<QWidget_*> *in_stack_ffffffffffffff38;
  QPaintDevice *local_c0;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QWidgetPrivate *pQVar5;
  undefined2 uVar6;
  WId in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  QWidget *in_stack_ffffffffffffff88;
  undefined8 local_6c;
  undefined8 local_64;
  QFlagsStorageHelper<Qt::WindowType,_4> local_5c;
  char local_48 [32];
  undefined4 in_stack_ffffffffffffffe0;
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = this;
  parent = q_func(this);
  uVar6 = (undefined2)((ulong)pQVar5 >> 0x30);
  *(uint *)&this->field_0x30 = *(uint *)&this->field_0x30 & 0xfffffffe | 1;
  *(uint *)&this->field_0x30 = *(uint *)&this->field_0x30 & 0xfffffbff | 0x400;
  QCoreApplication::instance();
  pQVar4 = qobject_cast<QApplication*>((QObject *)0x35bb07);
  if (pQVar4 == (QApplication *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
               (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(char *)in_stack_ffffffffffffff18);
    QMessageLogger::fatal(local_48,"QWidget: Cannot create a QWidget without QApplication");
  }
  if (allWidgets != (QWidgetSet *)0x0) {
    QSet<QWidget_*>::insert(in_stack_ffffffffffffff38,(QWidget **)in_stack_ffffffffffffff30);
  }
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xffffefff | 0x1000;
  (this->data).winid = 0;
  (this->data).widget_attributes = 0;
  (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i = in_EDX;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfffffff0;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xffffff0f;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xffff1fff | 0x2000;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfffcffff;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfffffeff;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfffffdff;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfffffbff;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfffff7ff;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfffbffff;
  local_5c.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       QFlags<Qt::WindowType>::operator&
                 ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff20,
                  (WindowType)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
  if (IVar2 != 0) {
    *(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 & 0xff7fffff | 0x800000;
    QWidget::setAttribute
              (in_stack_ffffffffffffff88,(WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffff80 >> 0x18,0));
  }
  QWidget::setAttribute
            (in_stack_ffffffffffffff88,(WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff80 >> 0x18,0));
  adjustQuitOnCloseAttribute(in_stack_ffffffffffffff20);
  QWidget::setAttribute
            (in_stack_ffffffffffffff88,(WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff80 >> 0x18,0));
  awidth = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  aleft = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    QRect::QRect(in_stack_ffffffffffffff28,aleft,(int)in_stack_ffffffffffffff20,awidth,
                 (int)in_stack_ffffffffffffff18);
    lhs.i = (Int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  }
  else {
    QRect::QRect(in_stack_ffffffffffffff28,aleft,(int)in_stack_ffffffffffffff20,awidth,
                 (int)in_stack_ffffffffffffff18);
    lhs.i = (Int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  }
  (this->data).crect.x1 = (Representation)(undefined4)local_6c;
  (this->data).crect.y1 = (Representation)local_6c._4_4_;
  (this->data).crect.x2 = (Representation)(undefined4)local_64;
  (this->data).crect.y2 = (Representation)local_64._4_4_;
  initFocusChain(in_stack_ffffffffffffff30);
  QFlags<Qt::WindowType>::operator&
            ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff20,
             (WindowType)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  bVar1 = ::operator==((QFlags<Qt::WindowType>)lhs.i,(WindowType)in_stack_ffffffffffffff20);
  if (bVar1) {
    QWidget::create(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,SUB21((ushort)uVar6 >> 8,0),
                    SUB21(uVar6,0));
  }
  else if (ctx == (EVP_PKEY_CTX *)0x0) {
    adjustFlags((WindowFlags *)this,
                (QWidget *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    resolveLayoutDirection(in_stack_ffffffffffffff30);
    QWidget::palette((QWidget *)in_stack_ffffffffffffff20);
    QPalette::brush((QPalette *)in_stack_ffffffffffffff20,
                    (ColorRole)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    bVar1 = QWidget::isWindow((QWidget *)in_stack_ffffffffffffff20);
    if ((bVar1) && (BVar3 = QBrush::style((QBrush *)0x35be68), BVar3 != NoBrush)) {
      QBrush::isOpaque();
    }
    setOpaque(in_stack_ffffffffffffff20,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
  }
  else {
    QWidget::setParent((QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),parent,
                       in_stack_00000120);
  }
  local_c0 = (QPaintDevice *)0x0;
  if (parent != (QWidget *)0x0) {
    local_c0 = &parent->super_QPaintDevice;
  }
  QFont::QFont(local_18,&(this->data).fnt,local_c0);
  QFont::operator=((QFont *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  QFont::~QFont(local_18);
  QWidget::setAttribute
            (in_stack_ffffffffffffff88,(WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff80 >> 0x18,0));
  QWidget::setAttribute
            (in_stack_ffffffffffffff88,(WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff80 >> 0x18,0));
  instanceCounter = instanceCounter + 1;
  if (maxInstances < instanceCounter) {
    maxInstances = instanceCounter;
  }
  this_01 = (QEvent *)&stack0xffffffffffffff78;
  QEvent::QEvent(this_01,Create);
  QCoreApplication::sendEvent(&parent->super_QObject,this_01);
  this_00 = (QEvent *)operator_new(0x10);
  QEvent::QEvent(this_00,PolishRequest);
  QCoreApplication::postEvent(&parent->super_QObject,this_00,0);
  this->extraPaintEngine = (QPaintEngine *)0x0;
  QEvent::~QEvent(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::init(QWidget *parentWidget, Qt::WindowFlags f)
{
    Q_Q(QWidget);
    isWidget = true;
    wasWidget = true;

    Q_ASSERT_X(q != parentWidget, Q_FUNC_INFO, "Cannot parent a QWidget to itself");

    if (Q_UNLIKELY(!qobject_cast<QApplication *>(QCoreApplication::instance())))
        qFatal("QWidget: Cannot create a QWidget without QApplication");

    Q_ASSERT(allWidgets);
    if (allWidgets)
        allWidgets->insert(q);

#if QT_CONFIG(thread)
    if (!parent) {
        Q_ASSERT_X(QThread::isMainThread(), "QWidget",
                   "Widgets must be created in the GUI thread.");
    }
#endif

    data.fstrut_dirty = true;

    data.winid = 0;
    data.widget_attributes = 0;
    data.window_flags = f;
    data.window_state = 0;
    data.focus_policy = 0;
    data.context_menu_policy = Qt::DefaultContextMenu;
    data.window_modality = Qt::NonModal;

    data.sizehint_forced = 0;
    data.is_closing = false;
    data.in_show = 0;
    data.in_set_window_state = 0;
    data.in_destructor = false;

    // Widgets with Qt::MSWindowsOwnDC (typically QGLWidget) must have a window handle.
    if (f & Qt::MSWindowsOwnDC) {
        mustHaveWindowHandle = 1;
        q->setAttribute(Qt::WA_NativeWindow);
    }

    q->setAttribute(Qt::WA_QuitOnClose); // might be cleared in adjustQuitOnCloseAttribute()
    adjustQuitOnCloseAttribute();

    q->setAttribute(Qt::WA_WState_Hidden);

    //give potential windows a bigger "pre-initial" size; create() will give them a new size later
    data.crect = parentWidget ? QRect(0,0,100,30) : QRect(0,0,640,480);
    initFocusChain();

    if ((f & Qt::WindowType_Mask) == Qt::Desktop)
        q->create();
    else if (parentWidget)
        q->setParent(parentWidget, data.window_flags);
    else {
        adjustFlags(data.window_flags, q);
        resolveLayoutDirection();
        // opaque system background?
        const QBrush &background = q->palette().brush(QPalette::Window);
        setOpaque(q->isWindow() && background.style() != Qt::NoBrush && background.isOpaque());
    }
    data.fnt = QFont(data.fnt, q);

    q->setAttribute(Qt::WA_PendingMoveEvent);
    q->setAttribute(Qt::WA_PendingResizeEvent);

    if (++QWidgetPrivate::instanceCounter > QWidgetPrivate::maxInstances)
        QWidgetPrivate::maxInstances = QWidgetPrivate::instanceCounter;

    QEvent e(QEvent::Create);
    QCoreApplication::sendEvent(q, &e);
    QCoreApplication::postEvent(q, new QEvent(QEvent::PolishRequest));

    extraPaintEngine = nullptr;
}